

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::check_crfile
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  Char_conflict *pCVar1;
  bool bVar2;
  size_t sVar3;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  CharCount CVar5;
  byte bVar6;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last;
  bool *pbVar7;
  Iterator item_it;
  anon_class_8_1_8991fb9c local_30;
  
  sVar3 = path_distance<cpsm::PlatformPathTraits,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->crfile_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->crfile_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  this->crfile_path_distance_ = sVar3;
  bVar6 = sVar3 != 0 | this->match_crfile_;
  if (bVar6 == 1) {
    _Var4._M_current =
         (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    last._M_current =
         (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((_Var4._M_current != last._M_current) && (last._M_current[-1] == '/')) {
      last._M_current = last._M_current + -1;
    }
    _Var4 = path_basename<cpsm::PlatformPathTraits,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                      (_Var4,last);
    (this->item_basename_)._M_current = _Var4._M_current;
    pCVar1 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pbVar7 = &(this->props_).
              super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
              ._M_impl.super__Vector_impl_data._M_start
              [(long)_Var4._M_current -
               (long)(this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start].alphanumeric;
    for (; _Var4._M_current != pCVar1; _Var4._M_current = _Var4._M_current + 1) {
      bVar2 = SimpleStringTraits::is_alphanumeric(*_Var4._M_current);
      *pbVar7 = bVar2;
      pbVar7 = pbVar7 + 3;
    }
    local_30.this = this;
    CVar5 = check_crfile::anon_class_8_1_8991fb9c::operator()(&local_30);
    this->crfile_basename_shared_words_ = CVar5;
    this->unmatched_suffix_len_ =
         (long)(this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)(this->item_basename_)._M_current;
  }
  return (bool)bVar6;
}

Assistant:

bool check_crfile() {
    crfile_path_distance_ = path_distance<PathTraits>(
        item_.cbegin(), item_.cend(), crfile_.cbegin(), crfile_.cend());
    if (!match_crfile_ && crfile_path_distance_ == 0) {
      return false;
    }
    // If the last character in the item is a path separator, skip it for the
    // purposes of determining the item basename to be consistent with
    // `consume_path_component_match_front`.
    if (!item_.empty() && PathTraits::is_path_separator(item_.back())) {
      item_basename_ =
          path_basename<PathTraits>(item_.cbegin(), item_.cend() - 1);
    } else {
      item_basename_ = path_basename<PathTraits>(item_.cbegin(), item_.cend());
    }
    auto props_it = props_.begin() + (item_basename_ - item_.cbegin());
    for (auto item_it = item_basename_, item_last = item_.cend();
         item_it != item_last; ++item_it, ++props_it) {
      props_it->alphanumeric = StringTraits::is_alphanumeric(*item_it);
    }
    crfile_basename_shared_words_ = [this]() -> CharCount {
      auto crfile_word_end_it = crfile_basename_word_ends_.cbegin();
      auto const crfile_word_end_last = crfile_basename_word_ends_.cend();
      if (crfile_word_end_it == crfile_word_end_last) {
        return 0;
      }
      for (auto item_it = item_basename_, item_last = item_.cend(),
                crfile_it = crfile_basename_, crfile_last = crfile_.cend();
           item_it != item_last && crfile_it != crfile_last &&
               *item_it == *crfile_it;
           ++item_it, ++crfile_it) {
        if (crfile_it == *crfile_word_end_it) {
          ++crfile_word_end_it;
          if (crfile_word_end_it == crfile_word_end_last) {
            // Only counts if the next character is plausibly not the
            // continuation of a word.
            std::size_t const i = item_it - item_.cbegin();
            if ((i + 1 < item_.size()) && !props_[i + 1].uppercase &&
                props_[i + 1].alphanumeric) {
              --crfile_word_end_it;
            }
            break;
          }
        }
      }
      return crfile_word_end_it - crfile_basename_word_ends_.cbegin();
    }();
    // Ensure that `unmatched_suffix_len_` is initialized even for empty
    // queries.
    unmatched_suffix_len_ = item_.cend() - item_basename_;
    return true;
  }